

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<int>(int expected,string *value)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  size_type sVar5;
  byte bVar6;
  char *pcVar7;
  char *in_R9;
  AssertionResult gtest_ar_;
  int result;
  int result2;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  Message local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  int local_40;
  int local_3c;
  AssertHelper local_38;
  string local_30;
  
  sVar2 = value->_M_string_length;
  local_40 = 0;
  local_3c = expected;
  if (sVar2 == 0) {
LAB_001205e4:
    local_50.ss_.ptr_._0_1_ = (internal)0x0;
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_50,(AssertionResult *)0x1424ac,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p
                                    ));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (((local_58.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_58.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    pcVar4 = (value->_M_dataplus)._M_p;
    pcVar7 = pcVar4 + sVar2;
    local_40 = 0;
    if (*pcVar4 == '-') {
      if (sVar2 == 1) goto LAB_001205e4;
      pcVar4 = pcVar4 + 1;
      local_40 = 0;
      do {
        if ((byte)(*pcVar4 - 0x3aU) < 0xf6) goto LAB_001205e4;
        bVar6 = *pcVar4 - 0x30;
        if (local_40 < -0xccccccc) goto LAB_001205e4;
        if (local_40 == -0xccccccc && 8 < bVar6) {
          local_40 = -0xccccccc;
          goto LAB_001205e4;
        }
        local_40 = local_40 * 10 - (uint)bVar6;
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 < pcVar7);
    }
    else {
      if (*pcVar4 == '+') {
        pcVar4 = pcVar4 + 1;
      }
      if (pcVar4 == pcVar7) goto LAB_001205e4;
      local_40 = 0;
      do {
        if ((byte)(*pcVar4 - 0x3aU) < 0xf6) goto LAB_001205e4;
        bVar6 = *pcVar4 - 0x30;
        if (0xccccccc < local_40) goto LAB_001205e4;
        if (local_40 == 0xccccccc && 7 < bVar6) {
          local_40 = 0xccccccc;
          goto LAB_001205e4;
        }
        local_40 = (uint)bVar6 + local_40 * 10;
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 < pcVar7);
    }
    local_50.ss_.ptr_._0_1_ = (internal)0x1;
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_30,"expected","result",&local_3c,&local_40);
    if ((char)local_30._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_50);
      if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_30._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0x19,pcVar7);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (((CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_30._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_30._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      sVar2 = value->_M_string_length;
      local_38.data_._0_4_ = 0;
      if (sVar2 != 0) {
        pcVar7 = (value->_M_dataplus)._M_p;
        local_38.data_._0_4_ = 0;
        if (*pcVar7 == '-') {
          if (sVar2 != 1) {
            local_38.data_._0_4_ = 0;
            sVar5 = 1;
            do {
              local_38.data_._0_4_ = ((int)local_38.data_ * 10 - (int)pcVar7[sVar5]) + 0x30;
              sVar5 = sVar5 + 1;
            } while (sVar2 != sVar5);
          }
        }
        else {
          pcVar4 = pcVar7 + sVar2;
          if (*pcVar7 == '+') {
            pcVar7 = pcVar7 + 1;
          }
          if (pcVar7 != pcVar4) {
            local_38.data_._0_4_ = 0;
            do {
              cVar1 = *pcVar7;
              pcVar7 = pcVar7 + 1;
              local_38.data_._0_4_ = (int)cVar1 + (int)local_38.data_ * 10 + -0x30;
            } while (pcVar7 != pcVar4);
          }
        }
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_30,"expected","result2",&local_3c,(int *)&local_38);
      if ((char)local_30._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_50);
        if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_30._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_58,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (((CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_30._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}